

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O3

void __thiscall perfetto::protos::gen::TraceConfig::Serialize(TraceConfig *this,Message *msg)

{
  pointer pTVar1;
  pointer pTVar2;
  _Head_base<0UL,_perfetto::protos::gen::TraceConfig_BuiltinDataSource_*,_false> this_00;
  pointer pTVar3;
  _WordT _Var4;
  _Head_base<0UL,_perfetto::protos::gen::TraceConfig_StatsdMetadata_*,_false> this_01;
  _Head_base<0UL,_perfetto::protos::gen::TraceConfig_GuardrailOverrides_*,_false> this_02;
  _Head_base<0UL,_perfetto::protos::gen::TraceConfig_TriggerConfig_*,_false> this_03;
  pointer pbVar5;
  _Head_base<0UL,_perfetto::protos::gen::TraceConfig_IncrementalStateConfig_*,_false> this_04;
  _Head_base<0UL,_perfetto::protos::gen::TraceConfig_IncidentReportConfig_*,_false> this_05;
  _Head_base<0UL,_perfetto::protos::gen::TraceConfig_TraceFilter_*,_false> this_06;
  _Head_base<0UL,_perfetto::protos::gen::TraceConfig_AndroidReportConfig_*,_false> this_07;
  _Head_base<0UL,_perfetto::protos::gen::TraceConfig_CmdTraceStartDelay_*,_false> this_08;
  uint8_t *src_begin;
  uint uVar6;
  Message *pMVar7;
  ulong uVar8;
  TraceConfig_BufferConfig *it;
  pointer this_09;
  pointer this_10;
  pointer this_11;
  pointer pbVar9;
  
  pTVar1 = (this->buffers_).
           super__Vector_base<perfetto::protos::gen::TraceConfig_BufferConfig,_std::allocator<perfetto::protos::gen::TraceConfig_BufferConfig>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (this_09 = (this->buffers_).
                 super__Vector_base<perfetto::protos::gen::TraceConfig_BufferConfig,_std::allocator<perfetto::protos::gen::TraceConfig_BufferConfig>_>
                 ._M_impl.super__Vector_impl_data._M_start; this_09 != pTVar1; this_09 = this_09 + 1
      ) {
    pMVar7 = protozero::Message::BeginNestedMessageInternal(msg,1);
    TraceConfig_BufferConfig::Serialize(this_09,pMVar7);
  }
  pTVar2 = (this->data_sources_).
           super__Vector_base<perfetto::protos::gen::TraceConfig_DataSource,_std::allocator<perfetto::protos::gen::TraceConfig_DataSource>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (this_10 = (this->data_sources_).
                 super__Vector_base<perfetto::protos::gen::TraceConfig_DataSource,_std::allocator<perfetto::protos::gen::TraceConfig_DataSource>_>
                 ._M_impl.super__Vector_impl_data._M_start; this_10 != pTVar2; this_10 = this_10 + 1
      ) {
    pMVar7 = protozero::Message::BeginNestedMessageInternal(msg,2);
    TraceConfig_DataSource::Serialize(this_10,pMVar7);
  }
  uVar8 = (this->_has_field_).super__Base_bitset<1UL>._M_w;
  if (((uint)uVar8 >> 0x14 & 1) != 0) {
    this_00._M_head_impl =
         (this->builtin_data_sources_).ptr_._M_t.
         super___uniq_ptr_impl<perfetto::protos::gen::TraceConfig_BuiltinDataSource,_std::default_delete<perfetto::protos::gen::TraceConfig_BuiltinDataSource>_>
         ._M_t.
         super__Tuple_impl<0UL,_perfetto::protos::gen::TraceConfig_BuiltinDataSource_*,_std::default_delete<perfetto::protos::gen::TraceConfig_BuiltinDataSource>_>
         .super__Head_base<0UL,_perfetto::protos::gen::TraceConfig_BuiltinDataSource_*,_false>.
         _M_head_impl;
    pMVar7 = protozero::Message::BeginNestedMessageInternal(msg,0x14);
    TraceConfig_BuiltinDataSource::Serialize(this_00._M_head_impl,pMVar7);
    uVar8 = (this->_has_field_).super__Base_bitset<1UL>._M_w;
  }
  if ((uVar8 & 8) != 0) {
    protozero::Message::AppendVarInt<unsigned_int>(msg,3,this->duration_ms_);
    uVar8 = (this->_has_field_).super__Base_bitset<1UL>._M_w;
  }
  if ((uVar8 & 0x10) != 0) {
    protozero::Message::AppendTinyVarInt(msg,4,(uint)this->enable_extra_guardrails_);
    uVar8 = (this->_has_field_).super__Base_bitset<1UL>._M_w;
  }
  if ((uVar8 & 0x20) != 0) {
    protozero::Message::AppendVarInt<perfetto::protos::gen::TraceConfig_LockdownModeOperation>
              (msg,5,this->lockdown_mode_);
  }
  pTVar3 = (this->producers_).
           super__Vector_base<perfetto::protos::gen::TraceConfig_ProducerConfig,_std::allocator<perfetto::protos::gen::TraceConfig_ProducerConfig>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (this_11 = (this->producers_).
                 super__Vector_base<perfetto::protos::gen::TraceConfig_ProducerConfig,_std::allocator<perfetto::protos::gen::TraceConfig_ProducerConfig>_>
                 ._M_impl.super__Vector_impl_data._M_start; this_11 != pTVar3; this_11 = this_11 + 1
      ) {
    pMVar7 = protozero::Message::BeginNestedMessageInternal(msg,6);
    TraceConfig_ProducerConfig::Serialize(this_11,pMVar7);
  }
  _Var4 = (this->_has_field_).super__Base_bitset<1UL>._M_w;
  uVar6 = (uint)_Var4;
  if ((char)_Var4 < '\0') {
    this_01._M_head_impl =
         (this->statsd_metadata_).ptr_._M_t.
         super___uniq_ptr_impl<perfetto::protos::gen::TraceConfig_StatsdMetadata,_std::default_delete<perfetto::protos::gen::TraceConfig_StatsdMetadata>_>
         ._M_t.
         super__Tuple_impl<0UL,_perfetto::protos::gen::TraceConfig_StatsdMetadata_*,_std::default_delete<perfetto::protos::gen::TraceConfig_StatsdMetadata>_>
         .super__Head_base<0UL,_perfetto::protos::gen::TraceConfig_StatsdMetadata_*,_false>.
         _M_head_impl;
    pMVar7 = protozero::Message::BeginNestedMessageInternal(msg,7);
    TraceConfig_StatsdMetadata::Serialize(this_01._M_head_impl,pMVar7);
    uVar6 = (uint)(this->_has_field_).super__Base_bitset<1UL>._M_w;
  }
  if ((uVar6 >> 8 & 1) != 0) {
    protozero::Message::AppendTinyVarInt(msg,8,(uint)this->write_into_file_);
    uVar6 = (uint)(this->_has_field_).super__Base_bitset<1UL>._M_w;
  }
  if ((uVar6 >> 0x1d & 1) != 0) {
    protozero::Message::AppendBytes
              (msg,0x1d,(this->output_path_)._M_dataplus._M_p,(this->output_path_)._M_string_length)
    ;
    uVar6 = (uint)(this->_has_field_).super__Base_bitset<1UL>._M_w;
  }
  if ((uVar6 >> 9 & 1) != 0) {
    protozero::Message::AppendVarInt<unsigned_int>(msg,9,this->file_write_period_ms_);
    uVar6 = (uint)(this->_has_field_).super__Base_bitset<1UL>._M_w;
  }
  if ((uVar6 >> 10 & 1) != 0) {
    protozero::Message::AppendVarInt<unsigned_long>(msg,10,this->max_file_size_bytes_);
    uVar6 = (uint)(this->_has_field_).super__Base_bitset<1UL>._M_w;
  }
  if ((uVar6 >> 0xb & 1) != 0) {
    this_02._M_head_impl =
         (this->guardrail_overrides_).ptr_._M_t.
         super___uniq_ptr_impl<perfetto::protos::gen::TraceConfig_GuardrailOverrides,_std::default_delete<perfetto::protos::gen::TraceConfig_GuardrailOverrides>_>
         ._M_t.
         super__Tuple_impl<0UL,_perfetto::protos::gen::TraceConfig_GuardrailOverrides_*,_std::default_delete<perfetto::protos::gen::TraceConfig_GuardrailOverrides>_>
         .super__Head_base<0UL,_perfetto::protos::gen::TraceConfig_GuardrailOverrides_*,_false>.
         _M_head_impl;
    pMVar7 = protozero::Message::BeginNestedMessageInternal(msg,0xb);
    TraceConfig_GuardrailOverrides::Serialize(this_02._M_head_impl,pMVar7);
    uVar6 = (uint)(this->_has_field_).super__Base_bitset<1UL>._M_w;
  }
  if ((uVar6 >> 0xc & 1) != 0) {
    protozero::Message::AppendTinyVarInt(msg,0xc,(uint)this->deferred_start_);
    uVar6 = (uint)(this->_has_field_).super__Base_bitset<1UL>._M_w;
  }
  if ((uVar6 >> 0xd & 1) != 0) {
    protozero::Message::AppendVarInt<unsigned_int>(msg,0xd,this->flush_period_ms_);
    uVar6 = (uint)(this->_has_field_).super__Base_bitset<1UL>._M_w;
  }
  if ((uVar6 >> 0xe & 1) != 0) {
    protozero::Message::AppendVarInt<unsigned_int>(msg,0xe,this->flush_timeout_ms_);
    uVar6 = (uint)(this->_has_field_).super__Base_bitset<1UL>._M_w;
  }
  if ((uVar6 >> 0x17 & 1) != 0) {
    protozero::Message::AppendVarInt<unsigned_int>(msg,0x17,this->data_source_stop_timeout_ms_);
    uVar6 = (uint)(this->_has_field_).super__Base_bitset<1UL>._M_w;
  }
  if ((uVar6 >> 0x10 & 1) != 0) {
    protozero::Message::AppendTinyVarInt(msg,0x10,(uint)this->notify_traceur_);
    uVar6 = (uint)(this->_has_field_).super__Base_bitset<1UL>._M_w;
  }
  if ((uVar6 >> 0x1e & 1) != 0) {
    protozero::Message::AppendVarInt<int>(msg,0x1e,this->bugreport_score_);
    uVar6 = (uint)(this->_has_field_).super__Base_bitset<1UL>._M_w;
  }
  if ((uVar6 >> 0x11 & 1) != 0) {
    this_03._M_head_impl =
         (this->trigger_config_).ptr_._M_t.
         super___uniq_ptr_impl<perfetto::protos::gen::TraceConfig_TriggerConfig,_std::default_delete<perfetto::protos::gen::TraceConfig_TriggerConfig>_>
         ._M_t.
         super__Tuple_impl<0UL,_perfetto::protos::gen::TraceConfig_TriggerConfig_*,_std::default_delete<perfetto::protos::gen::TraceConfig_TriggerConfig>_>
         .super__Head_base<0UL,_perfetto::protos::gen::TraceConfig_TriggerConfig_*,_false>.
         _M_head_impl;
    pMVar7 = protozero::Message::BeginNestedMessageInternal(msg,0x11);
    TraceConfig_TriggerConfig::Serialize(this_03._M_head_impl,pMVar7);
  }
  pbVar5 = (this->activate_triggers_).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar9 = (this->activate_triggers_).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pbVar9 != pbVar5; pbVar9 = pbVar9 + 1) {
    protozero::Message::AppendBytes(msg,0x12,(pbVar9->_M_dataplus)._M_p,pbVar9->_M_string_length);
  }
  uVar8 = (this->_has_field_).super__Base_bitset<1UL>._M_w;
  if (((uint)uVar8 >> 0x15 & 1) != 0) {
    this_04._M_head_impl =
         (this->incremental_state_config_).ptr_._M_t.
         super___uniq_ptr_impl<perfetto::protos::gen::TraceConfig_IncrementalStateConfig,_std::default_delete<perfetto::protos::gen::TraceConfig_IncrementalStateConfig>_>
         ._M_t.
         super__Tuple_impl<0UL,_perfetto::protos::gen::TraceConfig_IncrementalStateConfig_*,_std::default_delete<perfetto::protos::gen::TraceConfig_IncrementalStateConfig>_>
         .super__Head_base<0UL,_perfetto::protos::gen::TraceConfig_IncrementalStateConfig_*,_false>.
         _M_head_impl;
    pMVar7 = protozero::Message::BeginNestedMessageInternal(msg,0x15);
    TraceConfig_IncrementalStateConfig::Serialize(this_04._M_head_impl,pMVar7);
    uVar8 = (this->_has_field_).super__Base_bitset<1UL>._M_w;
  }
  if (((uint)uVar8 >> 0x13 & 1) != 0) {
    protozero::Message::AppendTinyVarInt(msg,0x13,(uint)this->allow_user_build_tracing_);
    uVar8 = (this->_has_field_).super__Base_bitset<1UL>._M_w;
  }
  if (((uint)uVar8 >> 0x16 & 1) != 0) {
    protozero::Message::AppendBytes
              (msg,0x16,(this->unique_session_name_)._M_dataplus._M_p,
               (this->unique_session_name_)._M_string_length);
    uVar8 = (this->_has_field_).super__Base_bitset<1UL>._M_w;
  }
  if (((uint)uVar8 >> 0x18 & 1) != 0) {
    protozero::Message::AppendVarInt<perfetto::protos::gen::TraceConfig_CompressionType>
              (msg,0x18,this->compression_type_);
    uVar8 = (this->_has_field_).super__Base_bitset<1UL>._M_w;
  }
  if (((uint)uVar8 >> 0x19 & 1) != 0) {
    this_05._M_head_impl =
         (this->incident_report_config_).ptr_._M_t.
         super___uniq_ptr_impl<perfetto::protos::gen::TraceConfig_IncidentReportConfig,_std::default_delete<perfetto::protos::gen::TraceConfig_IncidentReportConfig>_>
         ._M_t.
         super__Tuple_impl<0UL,_perfetto::protos::gen::TraceConfig_IncidentReportConfig_*,_std::default_delete<perfetto::protos::gen::TraceConfig_IncidentReportConfig>_>
         .super__Head_base<0UL,_perfetto::protos::gen::TraceConfig_IncidentReportConfig_*,_false>.
         _M_head_impl;
    pMVar7 = protozero::Message::BeginNestedMessageInternal(msg,0x19);
    TraceConfig_IncidentReportConfig::Serialize(this_05._M_head_impl,pMVar7);
    uVar8 = (this->_has_field_).super__Base_bitset<1UL>._M_w;
  }
  if ((int)uVar8 < 0) {
    protozero::Message::AppendVarInt<perfetto::protos::gen::TraceConfig_StatsdLogging>
              (msg,0x1f,this->statsd_logging_);
    uVar8 = (this->_has_field_).super__Base_bitset<1UL>._M_w;
  }
  if (((uint)uVar8 >> 0x1b & 1) != 0) {
    protozero::Message::AppendVarInt<long>(msg,0x1b,this->trace_uuid_msb_);
    uVar8 = (this->_has_field_).super__Base_bitset<1UL>._M_w;
  }
  if (((uint)uVar8 >> 0x1c & 1) != 0) {
    protozero::Message::AppendVarInt<long>(msg,0x1c,this->trace_uuid_lsb_);
    uVar8 = (this->_has_field_).super__Base_bitset<1UL>._M_w;
  }
  if ((uVar8 >> 0x21 & 1) != 0) {
    this_06._M_head_impl =
         (this->trace_filter_).ptr_._M_t.
         super___uniq_ptr_impl<perfetto::protos::gen::TraceConfig_TraceFilter,_std::default_delete<perfetto::protos::gen::TraceConfig_TraceFilter>_>
         ._M_t.
         super__Tuple_impl<0UL,_perfetto::protos::gen::TraceConfig_TraceFilter_*,_std::default_delete<perfetto::protos::gen::TraceConfig_TraceFilter>_>
         .super__Head_base<0UL,_perfetto::protos::gen::TraceConfig_TraceFilter_*,_false>.
         _M_head_impl;
    pMVar7 = protozero::Message::BeginNestedMessageInternal(msg,0x21);
    TraceConfig_TraceFilter::Serialize(this_06._M_head_impl,pMVar7);
    uVar8 = (this->_has_field_).super__Base_bitset<1UL>._M_w;
  }
  if ((uVar8 >> 0x22 & 1) != 0) {
    this_07._M_head_impl =
         (this->android_report_config_).ptr_._M_t.
         super___uniq_ptr_impl<perfetto::protos::gen::TraceConfig_AndroidReportConfig,_std::default_delete<perfetto::protos::gen::TraceConfig_AndroidReportConfig>_>
         ._M_t.
         super__Tuple_impl<0UL,_perfetto::protos::gen::TraceConfig_AndroidReportConfig_*,_std::default_delete<perfetto::protos::gen::TraceConfig_AndroidReportConfig>_>
         .super__Head_base<0UL,_perfetto::protos::gen::TraceConfig_AndroidReportConfig_*,_false>.
         _M_head_impl;
    pMVar7 = protozero::Message::BeginNestedMessageInternal(msg,0x22);
    TraceConfig_AndroidReportConfig::Serialize(this_07._M_head_impl,pMVar7);
    uVar8 = (this->_has_field_).super__Base_bitset<1UL>._M_w;
  }
  if ((uVar8 >> 0x23 & 1) != 0) {
    this_08._M_head_impl =
         (this->cmd_trace_start_delay_).ptr_._M_t.
         super___uniq_ptr_impl<perfetto::protos::gen::TraceConfig_CmdTraceStartDelay,_std::default_delete<perfetto::protos::gen::TraceConfig_CmdTraceStartDelay>_>
         ._M_t.
         super__Tuple_impl<0UL,_perfetto::protos::gen::TraceConfig_CmdTraceStartDelay_*,_std::default_delete<perfetto::protos::gen::TraceConfig_CmdTraceStartDelay>_>
         .super__Head_base<0UL,_perfetto::protos::gen::TraceConfig_CmdTraceStartDelay_*,_false>.
         _M_head_impl;
    pMVar7 = protozero::Message::BeginNestedMessageInternal(msg,0x23);
    TraceConfig_CmdTraceStartDelay::Serialize(this_08._M_head_impl,pMVar7);
  }
  src_begin = (uint8_t *)(this->unknown_fields_)._M_dataplus._M_p;
  protozero::Message::WriteToStream
            (msg,src_begin,src_begin + (this->unknown_fields_)._M_string_length);
  return;
}

Assistant:

void TraceConfig::Serialize(::protozero::Message* msg) const {
  // Field 1: buffers
  for (auto& it : buffers_) {
    it.Serialize(msg->BeginNestedMessage<::protozero::Message>(1));
  }

  // Field 2: data_sources
  for (auto& it : data_sources_) {
    it.Serialize(msg->BeginNestedMessage<::protozero::Message>(2));
  }

  // Field 20: builtin_data_sources
  if (_has_field_[20]) {
    (*builtin_data_sources_).Serialize(msg->BeginNestedMessage<::protozero::Message>(20));
  }

  // Field 3: duration_ms
  if (_has_field_[3]) {
    msg->AppendVarInt(3, duration_ms_);
  }

  // Field 4: enable_extra_guardrails
  if (_has_field_[4]) {
    msg->AppendTinyVarInt(4, enable_extra_guardrails_);
  }

  // Field 5: lockdown_mode
  if (_has_field_[5]) {
    msg->AppendVarInt(5, lockdown_mode_);
  }

  // Field 6: producers
  for (auto& it : producers_) {
    it.Serialize(msg->BeginNestedMessage<::protozero::Message>(6));
  }

  // Field 7: statsd_metadata
  if (_has_field_[7]) {
    (*statsd_metadata_).Serialize(msg->BeginNestedMessage<::protozero::Message>(7));
  }

  // Field 8: write_into_file
  if (_has_field_[8]) {
    msg->AppendTinyVarInt(8, write_into_file_);
  }

  // Field 29: output_path
  if (_has_field_[29]) {
    msg->AppendString(29, output_path_);
  }

  // Field 9: file_write_period_ms
  if (_has_field_[9]) {
    msg->AppendVarInt(9, file_write_period_ms_);
  }

  // Field 10: max_file_size_bytes
  if (_has_field_[10]) {
    msg->AppendVarInt(10, max_file_size_bytes_);
  }

  // Field 11: guardrail_overrides
  if (_has_field_[11]) {
    (*guardrail_overrides_).Serialize(msg->BeginNestedMessage<::protozero::Message>(11));
  }

  // Field 12: deferred_start
  if (_has_field_[12]) {
    msg->AppendTinyVarInt(12, deferred_start_);
  }

  // Field 13: flush_period_ms
  if (_has_field_[13]) {
    msg->AppendVarInt(13, flush_period_ms_);
  }

  // Field 14: flush_timeout_ms
  if (_has_field_[14]) {
    msg->AppendVarInt(14, flush_timeout_ms_);
  }

  // Field 23: data_source_stop_timeout_ms
  if (_has_field_[23]) {
    msg->AppendVarInt(23, data_source_stop_timeout_ms_);
  }

  // Field 16: notify_traceur
  if (_has_field_[16]) {
    msg->AppendTinyVarInt(16, notify_traceur_);
  }

  // Field 30: bugreport_score
  if (_has_field_[30]) {
    msg->AppendVarInt(30, bugreport_score_);
  }

  // Field 17: trigger_config
  if (_has_field_[17]) {
    (*trigger_config_).Serialize(msg->BeginNestedMessage<::protozero::Message>(17));
  }

  // Field 18: activate_triggers
  for (auto& it : activate_triggers_) {
    msg->AppendString(18, it);
  }

  // Field 21: incremental_state_config
  if (_has_field_[21]) {
    (*incremental_state_config_).Serialize(msg->BeginNestedMessage<::protozero::Message>(21));
  }

  // Field 19: allow_user_build_tracing
  if (_has_field_[19]) {
    msg->AppendTinyVarInt(19, allow_user_build_tracing_);
  }

  // Field 22: unique_session_name
  if (_has_field_[22]) {
    msg->AppendString(22, unique_session_name_);
  }

  // Field 24: compression_type
  if (_has_field_[24]) {
    msg->AppendVarInt(24, compression_type_);
  }

  // Field 25: incident_report_config
  if (_has_field_[25]) {
    (*incident_report_config_).Serialize(msg->BeginNestedMessage<::protozero::Message>(25));
  }

  // Field 31: statsd_logging
  if (_has_field_[31]) {
    msg->AppendVarInt(31, statsd_logging_);
  }

  // Field 27: trace_uuid_msb
  if (_has_field_[27]) {
    msg->AppendVarInt(27, trace_uuid_msb_);
  }

  // Field 28: trace_uuid_lsb
  if (_has_field_[28]) {
    msg->AppendVarInt(28, trace_uuid_lsb_);
  }

  // Field 33: trace_filter
  if (_has_field_[33]) {
    (*trace_filter_).Serialize(msg->BeginNestedMessage<::protozero::Message>(33));
  }

  // Field 34: android_report_config
  if (_has_field_[34]) {
    (*android_report_config_).Serialize(msg->BeginNestedMessage<::protozero::Message>(34));
  }

  // Field 35: cmd_trace_start_delay
  if (_has_field_[35]) {
    (*cmd_trace_start_delay_).Serialize(msg->BeginNestedMessage<::protozero::Message>(35));
  }

  msg->AppendRawProtoBytes(unknown_fields_.data(), unknown_fields_.size());
}